

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

int __thiscall google::protobuf::MessageLite::ByteSize(MessageLite *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->_vptr_MessageLite[0xc])();
  iVar1 = internal::ToIntSize(CONCAT44(extraout_var,iVar1));
  return iVar1;
}

Assistant:

int ByteSize() const { return internal::ToIntSize(ByteSizeLong()); }